

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

void parse_version(htsFormat *fmt,uchar *u,uchar *ulim)

{
  ushort *puVar1;
  short sVar2;
  int iVar3;
  ushort **ppuVar4;
  uchar *puVar5;
  char *slim;
  char *str;
  uchar *puVar6;
  
  (fmt->version).major = -1;
  (fmt->version).minor = -1;
  if (u < ulim) {
    ppuVar4 = __ctype_b_loc();
    puVar1 = *ppuVar4;
    puVar6 = u;
    do {
      if ((*(byte *)((long)puVar1 + (long)(char)*puVar6 * 2 + 1) & 8) == 0) {
        iVar3 = atoi((char *)u);
        (fmt->version).major = (short)iVar3;
        if (*puVar6 == '.') {
          puVar5 = puVar6 + 1;
          while( true ) {
            if (ulim <= puVar5) {
              return;
            }
            if ((*(byte *)((long)puVar1 + (long)(char)*puVar5 * 2 + 1) & 8) == 0) break;
            puVar5 = puVar5 + 1;
          }
          iVar3 = atoi((char *)(puVar6 + 1));
          sVar2 = (short)iVar3;
        }
        else {
          sVar2 = 0;
        }
        (fmt->version).minor = sVar2;
        return;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != ulim);
  }
  return;
}

Assistant:

static void
parse_version(htsFormat *fmt, const unsigned char *u, const unsigned char *ulim)
{
    const char *str  = (const char *) u;
    const char *slim = (const char *) ulim;
    const char *s;

    fmt->version.major = fmt->version.minor = -1;

    for (s = str; s < slim; s++) if (!isdigit(*s)) break;
    if (s < slim) {
        fmt->version.major = atoi(str);
        if (*s == '.') {
            str = &s[1];
            for (s = str; s < slim; s++) if (!isdigit(*s)) break;
            if (s < slim)
                fmt->version.minor = atoi(str);
        }
        else
            fmt->version.minor = 0;
    }
}